

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::PadPrefix_abi_cxx11_(string *__return_storage_ptr__,generator *this,string_view tag)

{
  AlphaNum *b;
  allocator<char> local_79;
  AlphaNum local_78;
  string_view local_48 [3];
  
  b = (AlphaNum *)tag._M_str;
  if (this == (generator *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_79);
  }
  else {
    local_48[0] = absl::lts_20250127::NullSafeStringView(" ");
    local_78.piece_._M_len = (size_t)this;
    local_78.piece_._M_str = (char *)tag._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PadPrefix(absl::string_view tag) {
  return tag.empty() ? "" : absl::StrCat(" ", tag);
}